

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall
TimerTest_detachedWithIterations_Test::~TimerTest_detachedWithIterations_Test
          (TimerTest_detachedWithIterations_Test *this)

{
  TimerTest_detachedWithIterations_Test *this_local;
  
  ~TimerTest_detachedWithIterations_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TimerTest, detachedWithIterations) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	{
		timer{period, total_iterations, [&iterations, &promise]([[maybe_unused]] timer& in_timer) {
			if (++iterations == total_iterations) {
				promise.set_value();
			}
		}}.detach();
	}

	EXPECT_EQ(promise.get_future().wait_for(timeout * 1000000), std::future_status::ready);
}